

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamHttp::~BamHttp(BamHttp *this)

{
  TcpSocket *this_00;
  pointer pcVar1;
  
  (this->super_IBamIODevice)._vptr_IBamIODevice = (_func_int **)&PTR__BamHttp_00179b08;
  DisconnectSocket(this);
  this->m_isUrlParsed = false;
  *(undefined4 *)&this->m_filePosition = 0xffffffff;
  *(undefined4 *)((long)&this->m_filePosition + 4) = 0xffffffff;
  *(undefined4 *)&this->m_fileEndPosition = 0xffffffff;
  *(undefined4 *)((long)&this->m_fileEndPosition + 4) = 0xffffffff;
  this->m_rangeEndPosition = -1;
  (this->super_IBamIODevice).m_mode = NotOpen;
  this_00 = this->m_socket;
  if (this_00 != (TcpSocket *)0x0) {
    TcpSocket::~TcpSocket(this_00);
    operator_delete(this_00);
  }
  pcVar1 = (this->m_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_filename).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_port)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_port).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_hostname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_hostname).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_IBamIODevice)._vptr_IBamIODevice = (_func_int **)&PTR__IBamIODevice_00179a88;
  pcVar1 = (this->super_IBamIODevice).m_errorString._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_IBamIODevice).m_errorString.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

BamHttp::~BamHttp()
{

    // close connection & clean up
    Close();
    if (m_socket) delete m_socket;
}